

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_crc32.cc
# Opt level: O3

void __thiscall CCRC32::Init_CRC32_Table(CCRC32 *this)

{
  int i;
  ulong uVar1;
  int iVar2;
  uint value;
  uint uVar3;
  uint value_1;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar1 = 0;
  do {
    iVar2 = 7;
    uVar3 = 0;
    uVar5 = uVar1 & 0xffffffff;
    do {
      uVar3 = uVar3 | 1 << ((byte)iVar2 & 0x1f) & -((uint)uVar5 & 1);
      uVar5 = uVar5 >> 1;
      bVar6 = iVar2 != 0;
      iVar2 = iVar2 + -1;
    } while (bVar6);
    uVar3 = uVar3 << 0x18;
    iVar2 = 8;
    do {
      uVar3 = (int)uVar3 >> 0x1f & 0x4c11db7U ^ uVar3 * 2;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    uVar4 = 0;
    iVar2 = 0x1f;
    do {
      uVar4 = uVar4 | 1 << ((byte)iVar2 & 0x1f) & -(uVar3 & 1);
      uVar3 = uVar3 >> 1;
      bVar6 = iVar2 != 0;
      iVar2 = iVar2 + -1;
    } while (bVar6);
    this->crc32_table[uVar1] = uVar4;
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x100);
  return;
}

Assistant:

void CCRC32::Init_CRC32_Table()
{
	// This is the official polynomial used by CRC-32 in PKZip, WinZip and Ethernet. 
	//unsigned long ulPolynomial = 0x04c11db7;
    unsigned int ulPolynomial = 0x04c11db7;

	// 256 values representing ASCII character codes.
	for(int i = 0; i <= 0xFF; i++)
	{
		crc32_table[i]=Reflect(i, 8) << 24;
        //if (i == 1)printf("old1--i=%d,crc32_table[%d] = %lu\r\n",i,i,crc32_table[i]);
        
		for (int j = 0; j < 8; j++)
        {
            //if(i == 1)
            //{
            //    unsigned int tmp1 = (crc32_table[i] << 1);
            //    unsigned int tmp2 = (crc32_table[i] & (1 << 31) ? ulPolynomial : 0);
            //    unsigned int tmp3 = tmp1 ^ tmp2;
            //    tmp3 += 1;
            //    tmp3 -= 1;
            //
            //}
            
			crc32_table[i] = (crc32_table[i] << 1) ^ (crc32_table[i] & (1 << 31) ? ulPolynomial : 0);
            //if (i == 1)printf("old3--i=%d,crc32_table[%d] = %lu\r\n",i,i,crc32_table[i]);
        }
        //if (i == 1)printf("old2--i=%d,crc32_table[%d] = %lu\r\n",i,i,crc32_table[i]);
		crc32_table[i] = Reflect(crc32_table[i], 32);
	}

}